

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Line *this;
  Coordinate this_00;
  CanvasController controller;
  shared_ptr<editor::figures::CanvasPrimitive> rectangle;
  shared_ptr<editor::figures::CanvasPrimitive> line;
  MainView view;
  Color local_9b;
  string local_98;
  CanvasController local_78;
  Coordinate local_68;
  shared_ptr<editor::figures::CanvasPrimitive> local_60;
  shared_ptr<editor::figures::CanvasPrimitive> local_50;
  MainView local_40;
  GraphicDocument local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- creating new document --",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_38.elements.
  super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.elements.
  super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.elements.
  super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  editor::MainView::MainView(&local_40,&local_38);
  editor::CanvasController::CanvasController(&local_78,&local_38,&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- loading document from file --",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"document.ed","");
  editor::CanvasController::import_document(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- adding line --",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  this = (Line *)operator_new(0x20);
  editor::Color::Color((Color *)&local_68,0xff,0xff,'\0');
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_60.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  editor::figures::Line::Line
            (this,(Color *)&local_68,(Coordinate *)&local_98,(Coordinate *)&local_60);
  local_50.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<editor::figures::Line*>
            (&local_50.
              super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this);
  editor::CanvasController::add_primitive(&local_78,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- adding rectangle --",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  this_00 = (Coordinate)operator_new(0x20);
  editor::Color::Color(&local_9b,'\0',0xff,'\0');
  local_98._M_dataplus._M_p = (pointer)0x1400000014;
  local_68.x = 100;
  local_68.y = 100;
  editor::figures::Rectangle::Rectangle
            ((Rectangle *)this_00,&local_9b,(Coordinate *)&local_98,&local_68);
  local_60.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<editor::figures::Rectangle*>
            (&local_60.
              super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Rectangle *)this_00);
  editor::CanvasController::add_primitive(&local_78,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- removing line --",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  editor::CanvasController::remove_primitive(&local_78,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- saving document to file --",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"document_modified.ed","");
  editor::CanvasController::export_document(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_60.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
  ::~vector(&local_38.elements);
  return 0;
}

Assistant:

int main() {
    std::cout << "-- creating new document --" << std::endl;
    editor::GraphicDocument model{}; // create new document
    editor::MainView view{model};
    editor::CanvasController controller(model, view);

    std::cout << "-- loading document from file --" << std::endl;
    controller.import_document("document.ed");

    namespace ef = editor::figures;
    std::cout << "-- adding line --" << std::endl;
    auto line = std::shared_ptr<ef::CanvasPrimitive>(
            new ef::Line{editor::Color{255, 255, 0}, editor::Coordinate{0, 0}, editor::Coordinate{1, 1}});
    controller.add_primitive(line);

    std::cout << "-- adding rectangle --" << std::endl;
    auto rectangle = std::shared_ptr<ef::CanvasPrimitive>(
            new ef::Rectangle{editor::Color{0, 255, 0}, editor::Coordinate{20, 20}, editor::Coordinate{100, 100}});
    controller.add_primitive(rectangle);

    std::cout << "-- removing line --" << std::endl;
    controller.remove_primitive(line);

    std::cout << "-- saving document to file --" << std::endl;
    controller.export_document("document_modified.ed");

    return 0;
}